

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O0

void __thiscall
Clasp::BasicProgramAdapter::minimize(BasicProgramAdapter *this,Weight_t prio,WeightLitSpan *lits)

{
  Literal LVar1;
  int iVar2;
  SatBuilder *this_00;
  SatBuilder *min;
  Span<Potassco::WeightLit_t> *in_RDX;
  int in_ESI;
  long in_RDI;
  iterator end;
  iterator it;
  undefined4 in_stack_ffffffffffffffc8;
  pair<Clasp::Literal,_int> in_stack_ffffffffffffffd0;
  
  if (in_ESI != 0) {
    Potassco::fail(-2,
                   "virtual void Clasp::BasicProgramAdapter::minimize(Potassco::Weight_t, const Potassco::WeightLitSpan &)"
                   ,0x18c,"prio == 0","unsupported rule type",0);
  }
  bk_lib::
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
  clear((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
         *)(in_RDI + 0x20));
  this_00 = (SatBuilder *)Potassco::begin<Potassco::WeightLit_t>(in_RDX);
  min = (SatBuilder *)Potassco::end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x1cc473);
  for (; this_00 != min; this_00 = (SatBuilder *)&(this_00->super_ProgramBuilder).ctx_) {
    LVar1 = toLit(0x1cc49d);
    std::pair<Clasp::Literal,_int>::pair<Clasp::Literal,_true>
              ((pair<Clasp::Literal,_int> *)&stack0xffffffffffffffd0,
               (Literal *)&stack0xffffffffffffffcc,
               (Weight_t *)((long)&(this_00->super_ProgramBuilder)._vptr_ProgramBuilder + 4));
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    push_back((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
               *)in_stack_ffffffffffffffd0,
              (pair<Clasp::Literal,_int> *)CONCAT44(LVar1.rep_,in_stack_ffffffffffffffc8));
  }
  iVar2 = ProgramBuilder::type((ProgramBuilder *)0x1cc4e5);
  if (iVar2 == 0) {
    SatBuilder::addObjective(this_00,(WeightLitVec *)min);
  }
  else {
    PBBuilder::addObjective((PBBuilder *)this_00,(WeightLitVec *)min);
  }
  return;
}

Assistant:

void BasicProgramAdapter::minimize(Potassco::Weight_t prio, const Potassco::WeightLitSpan& lits) {
	POTASSCO_REQUIRE(prio == 0, "unsupported rule type");
	using namespace Potassco;
	constraint_.clear();
	for (WeightLitSpan::iterator it = begin(lits), end = Potassco::end(lits); it != end; ++it) { constraint_.push_back(WeightLiteral(toLit(it->lit), it->weight)); }
	if (prg_->type() == Problem_t::Sat) {
		static_cast<SatBuilder&>(*prg_).addObjective(constraint_);
	}
	else {
		static_cast<PBBuilder&>(*prg_).addObjective(constraint_);
	}
}